

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

_Bool read_blob(BinarySource *src,int nlines,BinarySink *bs)

{
  int iVar1;
  int iVar2;
  char *ptr;
  char *__s;
  size_t sVar3;
  long lVar4;
  int iVar5;
  uchar decoded [3];
  
  if (0x1554 < nlines) {
    __assert_fail("nlines < MAX_KEY_BLOB_LINES",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x20d,"_Bool read_blob(BinarySource *, int, BinarySink *)");
  }
  iVar5 = 0;
  ptr = (char *)safemalloc((ulong)(uint)(nlines * 0x30),1,0);
  iVar1 = 0;
  if (0 < nlines) {
    iVar1 = nlines;
  }
  while( true ) {
    if ((iVar5 == iVar1) || (__s = read_body(src), __s == (char *)0x0)) goto LAB_001276f0;
    sVar3 = strlen(__s);
    if ((0x40 < (int)sVar3) || ((sVar3 & 3) != 0)) break;
    for (lVar4 = 0; lVar4 < (int)sVar3; lVar4 = lVar4 + 4) {
      iVar2 = base64_decode_atom(__s + lVar4,decoded);
      if (iVar2 == 0) {
        safefree(__s);
        safefree(ptr);
        goto LAB_001276c5;
      }
      BinarySink_put_data(bs->binarysink_,decoded,(long)iVar2);
    }
    safefree(__s);
    iVar5 = iVar5 + 1;
  }
  safefree(ptr);
  ptr = __s;
LAB_001276f0:
  safefree(ptr);
LAB_001276c5:
  return nlines <= iVar5;
}

Assistant:

static bool read_blob(BinarySource *src, int nlines, BinarySink *bs)
{
    unsigned char *blob;
    char *line;
    int linelen;
    int i, j, k;

    /* We expect at most 64 base64 characters, ie 48 real bytes, per line. */
    assert(nlines < MAX_KEY_BLOB_LINES);
    blob = snewn(48 * nlines, unsigned char);

    for (i = 0; i < nlines; i++) {
        line = read_body(src);
        if (!line) {
            sfree(blob);
            return false;
        }
        linelen = strlen(line);
        if (linelen % 4 != 0 || linelen > 64) {
            sfree(blob);
            sfree(line);
            return false;
        }
        for (j = 0; j < linelen; j += 4) {
            unsigned char decoded[3];
            k = base64_decode_atom(line + j, decoded);
            if (!k) {
                sfree(line);
                sfree(blob);
                return false;
            }
            put_data(bs, decoded, k);
        }
        sfree(line);
    }
    sfree(blob);
    return true;
}